

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmSwitch(ExpressionContext *ctx,VmModule *module,ExprSwitch *node)

{
  uint uVar1;
  LoopInfo *pLVar2;
  Allocator *pAVar3;
  int iVar4;
  VmBlock *pVVar5;
  VmBlock *block;
  VmBlock *block_00;
  VmValue *pVVar6;
  undefined4 extraout_var;
  char *__function;
  ExprBase *pEVar7;
  ulong uVar8;
  SmallArray<VmBlock_*,_16U> caseBlocks;
  SmallArray<VmBlock_*,_16U> conditionBlocks;
  SmallArray<VmBlock_*,_16U> local_160;
  SmallArray<VmBlock_*,_16U> local_c8;
  
  CompileVm(ctx,module,node->condition);
  local_160.allocator = module->allocator;
  local_c8.data = local_c8.little;
  local_c8.count = 0;
  local_c8.max = 0x10;
  local_160.data = local_160.little;
  local_160.count = 0;
  local_160.max = 0x10;
  local_c8.allocator = local_160.allocator;
  for (pEVar7 = (node->cases).head; pEVar7 != (ExprBase *)0x0; pEVar7 = pEVar7->next) {
    pVVar5 = anon_unknown.dwarf_22bf96::CreateBlock
                       (module,(node->super_ExprBase).source,"switch_case");
    if (local_c8.count == local_c8.max) {
      SmallArray<VmBlock_*,_16U>::grow(&local_c8,local_c8.count);
    }
    if (local_c8.data == (VmBlock **)0x0) goto LAB_002799db;
    uVar8 = (ulong)local_c8.count;
    local_c8.count = local_c8.count + 1;
    local_c8.data[uVar8] = pVVar5;
  }
  for (pEVar7 = (node->blocks).head; pEVar7 != (ExprBase *)0x0; pEVar7 = pEVar7->next) {
    pVVar5 = anon_unknown.dwarf_22bf96::CreateBlock
                       (module,(node->super_ExprBase).source,"case_block");
    if (local_160.count == local_160.max) {
      SmallArray<VmBlock_*,_16U>::grow(&local_160,local_160.count);
    }
    if (local_160.data == (VmBlock **)0x0) goto LAB_002799db;
    uVar8 = (ulong)local_160.count;
    local_160.count = local_160.count + 1;
    local_160.data[uVar8] = pVVar5;
  }
  block = anon_unknown.dwarf_22bf96::CreateBlock
                    (module,(node->super_ExprBase).source,"default_block");
  block_00 = anon_unknown.dwarf_22bf96::CreateBlock
                       (module,(node->super_ExprBase).source,"switch_exit");
  pVVar5 = block;
  if (local_c8.count != 0) {
    pVVar5 = *local_c8.data;
  }
  anon_unknown.dwarf_22bf96::CreateJump(module,(node->super_ExprBase).source,&pVVar5->super_VmValue)
  ;
  pEVar7 = (node->cases).head;
  if (pEVar7 != (ExprBase *)0x0) {
    uVar8 = 0;
    do {
      if ((local_c8.count <= uVar8) ||
         (VmFunction::AddBlock(module->currentFunction,local_c8.data[uVar8]),
         local_c8.count <= uVar8)) goto LAB_002799bc;
      module->currentBlock = local_c8.data[uVar8];
      pVVar6 = CompileVm(ctx,module,pEVar7);
      if (local_160.count <= uVar8) goto LAB_002799bc;
      pVVar5 = block;
      if (pEVar7->next != (ExprBase *)0x0) {
        if ((ulong)local_c8.count <= uVar8 + 1) goto LAB_002799bc;
        pVVar5 = local_c8.data[uVar8 + 1];
      }
      anon_unknown.dwarf_22bf96::CreateJumpNotZero
                (module,(node->super_ExprBase).source,pVVar6,&local_160.data[uVar8]->super_VmValue,
                 &pVVar5->super_VmValue);
      uVar8 = uVar8 + 1;
      pEVar7 = pEVar7->next;
    } while (pEVar7 != (ExprBase *)0x0);
  }
  uVar1 = (module->loopInfo).count;
  if (uVar1 == (module->loopInfo).max) {
    SmallArray<VmModule::LoopInfo,_32U>::grow(&module->loopInfo,uVar1);
  }
  pLVar2 = (module->loopInfo).data;
  if (pLVar2 != (LoopInfo *)0x0) {
    uVar1 = (module->loopInfo).count;
    (module->loopInfo).count = uVar1 + 1;
    pLVar2[uVar1].breakBlock = block_00;
    pLVar2[uVar1].continueBlock = (VmBlock *)0x0;
    pEVar7 = (node->blocks).head;
    if (pEVar7 != (ExprBase *)0x0) {
      uVar8 = 0;
      do {
        if ((local_160.count <= uVar8) ||
           (VmFunction::AddBlock(module->currentFunction,local_160.data[uVar8]),
           local_160.count <= uVar8)) goto LAB_002799bc;
        module->currentBlock = local_160.data[uVar8];
        CompileVm(ctx,module,pEVar7);
        pVVar5 = block;
        if (pEVar7->next != (ExprBase *)0x0) {
          if ((ulong)local_160.count <= uVar8 + 1) {
LAB_002799bc:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<VmBlock *, 16>::operator[](unsigned int) [T = VmBlock *, N = 16]"
                         );
          }
          pVVar5 = local_160.data[uVar8 + 1];
        }
        anon_unknown.dwarf_22bf96::CreateJump
                  (module,(node->super_ExprBase).source,&pVVar5->super_VmValue);
        uVar8 = uVar8 + 1;
        pEVar7 = pEVar7->next;
      } while (pEVar7 != (ExprBase *)0x0);
    }
    VmFunction::AddBlock(module->currentFunction,block);
    module->currentBlock = block;
    if (node->defaultBlock != (ExprBase *)0x0) {
      CompileVm(ctx,module,node->defaultBlock);
    }
    anon_unknown.dwarf_22bf96::CreateJump
              (module,(node->super_ExprBase).source,&block_00->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,block_00);
    module->currentBlock = block_00;
    uVar1 = (module->loopInfo).count;
    if (uVar1 != 0) {
      (module->loopInfo).count = uVar1 - 1;
      iVar4 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
      pVVar6 = (VmValue *)CONCAT44(extraout_var,iVar4);
      pAVar3 = module->allocator;
      pVVar6->typeID = 0;
      (pVVar6->type).type = VM_TYPE_VOID;
      (pVVar6->type).size = 0;
      (pVVar6->type).structType = (TypeBase *)0x0;
      pVVar6->source = (SynBase *)0x0;
      (pVVar6->comment).begin = (char *)0x0;
      (pVVar6->comment).end = (char *)0x0;
      (pVVar6->users).allocator = pAVar3;
      (pVVar6->users).data = (pVVar6->users).little;
      (pVVar6->users).count = 0;
      (pVVar6->users).max = 8;
      pVVar6->hasKnownNonSimpleUse = false;
      pVVar6->hasSideEffects = false;
      pVVar6->hasMemoryAccess = false;
      pVVar6->canBeRemoved = true;
      pVVar6->hasKnownSimpleUse = false;
      pVVar6->_vptr_VmValue = (_func_int **)&PTR__VmValue_003e8c60;
      anon_unknown.dwarf_22bf96::CheckType(ctx,(ExprBase *)(node->super_ExprBase).type,pVVar6);
      SmallArray<VmBlock_*,_16U>::~SmallArray(&local_160);
      SmallArray<VmBlock_*,_16U>::~SmallArray(&local_c8);
      return pVVar6;
    }
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x183,
                  "void SmallArray<VmModule::LoopInfo, 32>::pop_back() [T = VmModule::LoopInfo, N = 32]"
                 );
  }
  __function = 
  "void SmallArray<VmModule::LoopInfo, 32>::push_back(const T &) [T = VmModule::LoopInfo, N = 32]";
LAB_002799f0:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
LAB_002799db:
  __function = "void SmallArray<VmBlock *, 16>::push_back(const T &) [T = VmBlock *, N = 16]";
  goto LAB_002799f0;
}

Assistant:

VmValue* CompileVmSwitch(ExpressionContext &ctx, VmModule *module, ExprSwitch *node)
{
	CompileVm(ctx, module, node->condition);

	SmallArray<VmBlock*, 16> conditionBlocks(module->allocator);
	SmallArray<VmBlock*, 16> caseBlocks(module->allocator);

	// Generate blocks for all cases
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next)
		conditionBlocks.push_back(CreateBlock(module, node->source, "switch_case"));

	// Generate blocks for all cases
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next)
		caseBlocks.push_back(CreateBlock(module, node->source, "case_block"));

	VmBlock *defaultBlock = CreateBlock(module, node->source, "default_block");
	VmBlock *exitBlock = CreateBlock(module, node->source, "switch_exit");

	CreateJump(module, node->source, conditionBlocks.empty() ? defaultBlock : conditionBlocks[0]);

	unsigned i;

	// Generate code for all conditions
	i = 0;
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next, i++)
	{
		module->currentFunction->AddBlock(conditionBlocks[i]);
		module->currentBlock = conditionBlocks[i];

		VmValue *condition = CompileVm(ctx, module, curr);

		CreateJumpNotZero(module, node->source, condition, caseBlocks[i], curr->next ? conditionBlocks[i + 1] : defaultBlock);
	}

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, NULL));

	// Generate code for all cases
	i = 0;
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next, i++)
	{
		module->currentFunction->AddBlock(caseBlocks[i]);
		module->currentBlock = caseBlocks[i];

		CompileVm(ctx, module, curr);

		CreateJump(module, node->source, curr->next ? caseBlocks[i + 1] : defaultBlock);
	}

	// Create default block
	module->currentFunction->AddBlock(defaultBlock);
	module->currentBlock = defaultBlock;

	if(node->defaultBlock)
		CompileVm(ctx, module, node->defaultBlock);
	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}